

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int graph_5_4::prim_1(m_graph g)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uStack_30;
  uint auStack_28 [2];
  
  uVar8 = (ulong)(uint)g.vexs[8];
  lVar6 = -(uVar8 * 4 + 0xf & 0xfffffffffffffff0);
  lVar7 = lVar6 + -0x28;
  *(undefined8 *)((long)&uStack_30 + lVar6) = 1;
  for (lVar10 = *(long *)((long)&uStack_30 + lVar6); lVar10 < g.vexs[8]; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)auStack_28 + lVar10 * 4 + lVar7 + 0x28) =
         *(undefined4 *)((long)(g.arc + -1) + 0x20 + lVar10 * 4);
  }
  *(undefined8 *)((long)&uStack_30 + lVar6) = 0xffffffffffffffff;
  uVar4 = *(ulong *)((long)&uStack_30 + lVar6);
  *(undefined8 *)((long)&uStack_30 + lVar6) = 1;
  uVar5 = *(ulong *)((long)&uStack_30 + lVar6);
  do {
    iVar11 = 0;
    uVar13 = uVar4 & 0xffffffff;
    for (uVar12 = uVar5; uVar12 != uVar8; uVar12 = uVar12 + 1) {
      uVar1 = *(uint *)((long)auStack_28 + uVar12 * 4 + lVar7 + 0x28);
      if (uVar1 != 0 && (int)uVar1 < (int)uVar13) {
        uVar13 = (ulong)uVar1;
        iVar11 = (int)uVar12;
      }
      *(undefined4 *)((long)auStack_28 + (long)iVar11 * 4 + lVar7 + 0x28) = 0;
      for (uVar9 = uVar5; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        iVar2 = *(int *)((long)auStack_28 + uVar9 * 4 + lVar7 + 0x28);
        if ((iVar2 != 0) && (iVar3 = g.arc[(long)iVar11 + -1][uVar9 + 8], iVar3 < iVar2)) {
          *(int *)((long)auStack_28 + uVar9 * 4 + lVar7 + 0x28) = iVar3;
        }
      }
    }
  } while( true );
}

Assistant:

int prim_1(m_graph g) {
        int adjvex[g.vnum], dis[g.vnum], min, j, k;
        adjvex[0] = 0;
        dis[0] = 0;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adjvex[i] = 0;
        }
        for (int i = 0; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[j] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                j++;
                //visit (k);
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && g.arc[k][p] < dis[p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }